

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::LoadConfigFiles(cmExportInstallFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string glob;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  char *local_28;
  size_type local_20;
  pointer local_18;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# Load information for each installed configuration.\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"file(GLOB _cmake_config_files \"${CMAKE_CURRENT_LIST_DIR}/",0x39);
  local_40._M_str = (this->super_cmExportFileGenerator).FileBase._M_dataplus._M_p;
  local_40._M_len = (this->super_cmExportFileGenerator).FileBase._M_string_length;
  local_30 = 2;
  local_28 = "-*";
  local_18 = (this->super_cmExportFileGenerator).FileExt._M_dataplus._M_p;
  local_20 = (this->super_cmExportFileGenerator).FileExt._M_string_length;
  views._M_len = 3;
  views._M_array = &local_40;
  cmCatViews_abi_cxx11_(&local_60,views);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"foreach(_cmake_config_file IN LISTS _cmake_config_files)\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  include(\"${_cmake_config_file}\")\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"endforeach()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"unset(_cmake_config_file)\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"unset(_cmake_config_files)\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::LoadConfigFiles(std::ostream& os)
{
  // Now load per-configuration properties for them.
  /* clang-format off */
  os << "# Load information for each installed configuration.\n"
     << "file(GLOB _cmake_config_files \"${CMAKE_CURRENT_LIST_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(_cmake_config_file IN LISTS _cmake_config_files)\n"
     << "  include(\"${_cmake_config_file}\")\n"
     << "endforeach()\n"
     << "unset(_cmake_config_file)\n"
     << "unset(_cmake_config_files)\n"
     << "\n";
  /* clang-format on */
}